

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNextWindowCollapsed(bool collapsed,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  int in_ESI;
  byte in_DIL;
  ImGuiContext *g;
  ImGuiCond local_18;
  bool local_11;
  
  pIVar1 = GImGui;
  local_11 = true;
  if (in_ESI != 0) {
    local_11 = ImIsPowerOfTwo(in_ESI);
  }
  if (local_11 != false) {
    (pIVar1->NextWindowData).Flags = (pIVar1->NextWindowData).Flags | 8;
    (pIVar1->NextWindowData).CollapsedVal = (bool)(in_DIL & 1);
    local_18 = in_ESI;
    if (in_ESI == 0) {
      local_18 = 1;
    }
    (pIVar1->NextWindowData).CollapsedCond = local_18;
    return;
  }
  __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1a9e,"void ImGui::SetNextWindowCollapsed(bool, ImGuiCond)");
}

Assistant:

void ImGui::SetNextWindowCollapsed(bool collapsed, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasCollapsed;
    g.NextWindowData.CollapsedVal = collapsed;
    g.NextWindowData.CollapsedCond = cond ? cond : ImGuiCond_Always;
}